

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork_test.cpp
# Opt level: O0

void __thiscall
metacall_fork_test_DefaultConstructor_Test::TestBody
          (metacall_fork_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  __pid_t _Var2;
  char *pcVar3;
  ostream *poVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  char *in_stack_ffffffffffffff38;
  AssertHelper local_98;
  Message local_90;
  int local_88;
  undefined4 local_84;
  AssertionResult local_80;
  AssertHelper local_70;
  Message local_68;
  int local_60;
  undefined4 local_5c;
  AssertionResult local_58;
  uint local_44;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  metacall_print_info();
  metacall_flags(1);
  local_1c = 0;
  local_20 = metacall_initialize();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10aa59);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_fork_test/source/metacall_fork_test.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10aab6);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ab21);
  if (local_44 == 0) {
    metacall_fork(pre_callback_test,post_callback_test);
    _Var2 = fork();
    if (_Var2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"MetaCall fork child");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"MetaCall fork parent");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_5c = 1;
    local_60 = pre_callback_fired;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_ffffffffffffff38,
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      in_stack_ffffffffffffff38 =
           testing::AssertionResult::failure_message((AssertionResult *)0x10ac44);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_fork_test/source/metacall_fork_test.cpp"
                 ,0xa9,in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message((Message *)0x10ac98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10acea);
    local_84 = 1;
    local_88 = post_callback_fired;
    this_00 = &local_80;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_ffffffffffffff38,
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),(int *)this_00,
               in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10ad83);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_fork_test/source/metacall_fork_test.cpp"
                 ,0xaa,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::Message::~Message((Message *)0x10add1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ae1d);
    metacall_destroy();
  }
  return;
}

Assistant:

TEST_F(metacall_fork_test, DefaultConstructor)
{
	metacall_print_info();

	metacall_flags(METACALL_FLAGS_FORK_SAFE);

	ASSERT_EQ((int)0, (int)metacall_initialize());

	metacall_fork(&pre_callback_test, &post_callback_test);

	if (fork() == 0)
	{
		std::cout << "MetaCall fork child" << std::endl;
	}
	else
	{
		std::cout << "MetaCall fork parent" << std::endl;
	}

	EXPECT_EQ((int)1, (int)pre_callback_fired);
	EXPECT_EQ((int)1, (int)post_callback_fired);

	metacall_destroy();
}